

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_iso_xorriso.c
# Opt level: O2

void test_read_format_iso_xorriso(void)

{
  int iVar1;
  wchar_t wVar2;
  int iVar3;
  mode_t mVar4;
  archive_conflict *a;
  byte *pbVar5;
  char *pcVar6;
  long v2;
  stat *psVar7;
  la_int64_t lVar8;
  time_t tVar9;
  uint uVar10;
  longlong v1;
  ulong v2_00;
  __nlink_t v2_01;
  bool bVar11;
  longlong lStackY_70;
  archive_entry *ae;
  int64_t offset;
  void *p;
  size_t size;
  
  extract_reference_file("test_read_format_iso_xorriso.iso.Z");
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                   ,L'L',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'M',0,"0",(long)iVar1,"archive_read_support_filter_all(a)",(void *)0x0);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'N',0,"0",(long)iVar1,"archive_read_support_format_all(a)",(void *)0x0);
  wVar2 = archive_read_open_filename(a,"test_read_format_iso_xorriso.iso.Z",0x2800);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                      ,L'P',0,"ARCHIVE_OK",(long)wVar2,
                      "archive_read_open_filename(a, refname, 10240)",(void *)0x0);
  iVar1 = 10;
LAB_0016d402:
  do {
    while( true ) {
      while( true ) {
        iVar3 = archive_read_next_header((archive *)a,&ae);
        bVar11 = iVar1 == 0;
        iVar1 = iVar1 + -1;
        if (bVar11) {
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'Ë',1,"ARCHIVE_EOF",(long)iVar3,"archive_read_next_header(a, &ae)",
                              (void *)0x0);
          iVar1 = archive_filter_code((archive *)a,0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'Î',(long)iVar1,"archive_filter_code(a, 0)",3,
                              "ARCHIVE_FILTER_COMPRESS",(void *)0x0);
          iVar1 = archive_format((archive *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'Ï',(long)iVar1,"archive_format(a)",0x40001,
                              "ARCHIVE_FORMAT_ISO9660_ROCKRIDGE",(void *)0x0);
          iVar1 = archive_read_close((archive *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'Ò',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
          iVar1 = archive_read_free((archive *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'Ó',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
          return;
        }
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'U',0,"0",(long)iVar3,"archive_read_next_header(a, &ae)",(void *)0x0);
        wVar2 = archive_entry_is_encrypted(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'W',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
        iVar3 = archive_read_has_encrypted_entries((archive *)a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'X',(long)iVar3,"archive_read_has_encrypted_entries(a)",-2,
                            "ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED",a);
        pbVar5 = (byte *)archive_entry_pathname(ae);
        uVar10 = *pbVar5 - 0x2e;
        if (uVar10 == 0) {
          uVar10 = (uint)pbVar5[1];
        }
        if (uVar10 != 0) break;
        mVar4 = archive_entry_filetype(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\\',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar8 = archive_entry_size(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L']',0x800,"2048",lVar8,"archive_entry_size(ae)",(void *)0x0);
        tVar9 = archive_entry_mtime(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'_',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
        v2 = archive_entry_mtime_nsec(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'`',0,"0",v2,"archive_entry_mtime_nsec(ae)",(void *)0x0);
        uVar10 = archive_entry_nlink(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'b',4,"4",(ulong)uVar10,"archive_entry_nlink(ae)",(void *)0x0);
        iVar3 = archive_read_data_block((archive *)a,&p,&size,&offset);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'd',1,"ARCHIVE_EOF",(long)iVar3,
                            "archive_read_data_block(a, &p, &size, &offset)",a);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'e',(long)(int)size,"(int)size",0,"0",(void *)0x0);
      }
      pcVar6 = archive_entry_pathname(ae);
      iVar3 = strcmp("./dir",pcVar6);
      if (iVar3 != 0) break;
      mVar4 = archive_entry_filetype(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'h',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar8 = archive_entry_size(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'i',0x800,"2048",lVar8,"archive_entry_size(ae)",(void *)0x0);
      tVar9 = archive_entry_mtime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'j',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
      tVar9 = archive_entry_atime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'k',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
      uVar10 = archive_entry_nlink(ae);
      v2_00 = (ulong)uVar10;
      wVar2 = L'l';
LAB_0016da60:
      lStackY_70 = 2;
      pcVar6 = "2";
LAB_0016da6b:
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,wVar2,lStackY_70,pcVar6,v2_00,"archive_entry_nlink(ae)",(void *)0x0);
    }
    pcVar6 = archive_entry_pathname(ae);
    iVar3 = strcmp("./dir2",pcVar6);
    if (iVar3 == 0) {
      mVar4 = archive_entry_filetype(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'o',0x4000,"AE_IFDIR",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar8 = archive_entry_size(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'p',0x800,"2048",lVar8,"archive_entry_size(ae)",(void *)0x0);
      tVar9 = archive_entry_mtime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'q',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
      tVar9 = archive_entry_atime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'r',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
      uVar10 = archive_entry_nlink(ae);
      v2_00 = (ulong)uVar10;
      wVar2 = L's';
      goto LAB_0016da60;
    }
    pcVar6 = archive_entry_pathname(ae);
    iVar3 = strcmp("./file",pcVar6);
    if (iVar3 == 0) {
      mVar4 = archive_entry_filetype(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'w',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                          (void *)0x0);
      lVar8 = archive_entry_size(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'x',6,"6",lVar8,"archive_entry_size(ae)",(void *)0x0);
      iVar3 = archive_read_data_block((archive *)a,&p,&size,&offset);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'z',0,"0",(long)iVar3,"archive_read_data_block(a, &p, &size, &offset)",
                          (void *)0x0);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'{',0,"0",offset,"offset",(void *)0x0);
      assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'|',p,"p","hello\n","\"hello\\n\"",6,"6",(void *)0x0);
      tVar9 = archive_entry_mtime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'}',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
      tVar9 = archive_entry_atime(ae);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                          ,L'~',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
      uVar10 = archive_entry_nlink(ae);
      v2_00 = (ulong)uVar10;
      wVar2 = L'\x7f';
      goto LAB_0016da60;
    }
    pcVar6 = archive_entry_pathname(ae);
    iVar3 = strcmp("./hardlink",pcVar6);
    if (iVar3 != 0) {
      pcVar6 = archive_entry_pathname(ae);
      iVar3 = strcmp("./symlink",pcVar6);
      if (iVar3 == 0) {
        mVar4 = archive_entry_filetype(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x92',0xa000,"AE_IFLNK",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
        pcVar6 = archive_entry_symlink(ae);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                   ,L'\x93',"file","\"file\"",pcVar6,"archive_entry_symlink(ae)",(void *)0x0,L'\0');
        lVar8 = archive_entry_size(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x94',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
        tVar9 = archive_entry_mtime(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x95',0x2a302,"172802",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
        tVar9 = archive_entry_atime(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x96',0x2a302,"172802",tVar9,"archive_entry_atime(ae)",(void *)0x0);
        psVar7 = archive_entry_stat((archive_entry_conflict *)ae);
        v2_01 = psVar7->st_nlink;
        wVar2 = L'\x97';
        v1 = 1;
        pcVar6 = "1";
        goto LAB_0016dcd7;
      }
      pcVar6 = archive_entry_pathname(ae);
      iVar3 = strcmp("./empty",pcVar6);
      if (iVar3 == 0) {
        mVar4 = archive_entry_filetype(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x9b',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                            (void *)0x0);
        lVar8 = archive_entry_size(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x9c',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
        tVar9 = archive_entry_mtime(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x9d',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
        tVar9 = archive_entry_atime(ae);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                            ,L'\x9e',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
        uVar10 = archive_entry_nlink(ae);
        v2_00 = (ulong)uVar10;
        wVar2 = L'\x9f';
      }
      else {
        pcVar6 = archive_entry_pathname(ae);
        iVar3 = strcmp("./dir/file2",pcVar6);
        if (iVar3 == 0) {
          mVar4 = archive_entry_filetype(ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'£',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                              (void *)0x0);
          lVar8 = archive_entry_size(ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'¤',7,"7",lVar8,"archive_entry_size(ae)",(void *)0x0);
          iVar3 = archive_read_data_block((archive *)a,&p,&size,&offset);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'¦',0,"0",(long)iVar3,
                              "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'§',0,"0",offset,"offset",(void *)0x0);
          assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'¨',p,"p","hello2\n","\"hello2\\n\"",7,"7",(void *)0x0);
          tVar9 = archive_entry_mtime(ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'©',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
          tVar9 = archive_entry_atime(ae);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                              ,L'ª',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
          uVar10 = archive_entry_nlink(ae);
          v2_00 = (ulong)uVar10;
          wVar2 = L'«';
        }
        else {
          pcVar6 = archive_entry_pathname(ae);
          iVar3 = strcmp("./dir/file3",pcVar6);
          if (iVar3 == 0) {
            mVar4 = archive_entry_filetype(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'¯',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                                (void *)0x0);
            lVar8 = archive_entry_size(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'°',7,"7",lVar8,"archive_entry_size(ae)",(void *)0x0);
            iVar3 = archive_read_data_block((archive *)a,&p,&size,&offset);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'²',0,"0",(long)iVar3,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'³',0,"0",offset,"offset",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'´',p,"p","hello3\n","\"hello3\\n\"",7,"7",(void *)0x0);
            tVar9 = archive_entry_mtime(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'µ',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
            tVar9 = archive_entry_atime(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'¶',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
            uVar10 = archive_entry_nlink(ae);
            v2_00 = (ulong)uVar10;
            wVar2 = L'·';
          }
          else {
            pcVar6 = archive_entry_pathname(ae);
            iVar3 = strcmp("./dir2/file4",pcVar6);
            if (iVar3 != 0) {
              failure("Saw a file that shouldn\'t have been there");
              pcVar6 = archive_entry_pathname(ae);
              assertion_equal_string
                        ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                         ,L'Æ',pcVar6,"archive_entry_pathname(ae)","","\"\"",(void *)0x0,L'\0');
              goto LAB_0016d402;
            }
            mVar4 = archive_entry_filetype(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'»',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                                (void *)0x0);
            lVar8 = archive_entry_size(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'¼',7,"7",lVar8,"archive_entry_size(ae)",(void *)0x0);
            iVar3 = archive_read_data_block((archive *)a,&p,&size,&offset);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'¾',0,"0",(long)iVar3,
                                "archive_read_data_block(a, &p, &size, &offset)",(void *)0x0);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'¿',0,"0",offset,"offset",(void *)0x0);
            assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'À',p,"p","hello4\n","\"hello4\\n\"",7,"7",(void *)0x0);
            tVar9 = archive_entry_mtime(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'Á',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
            tVar9 = archive_entry_atime(ae);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                                ,L'Â',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
            uVar10 = archive_entry_nlink(ae);
            v2_00 = (ulong)uVar10;
            wVar2 = L'Ã';
          }
        }
      }
      lStackY_70 = 1;
      pcVar6 = "1";
      goto LAB_0016da6b;
    }
    mVar4 = archive_entry_filetype(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'\x88',0x8000,"AE_IFREG",(ulong)mVar4,"archive_entry_filetype(ae)",
                        (void *)0x0);
    pcVar6 = archive_entry_hardlink(ae);
    assertion_equal_string
              ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
               ,L'\x89',"./file","\"./file\"",pcVar6,"archive_entry_hardlink(ae)",(void *)0x0,L'\0')
    ;
    wVar2 = archive_entry_size_is_set(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'\x8a',0,"0",(long)wVar2,"archive_entry_size_is_set(ae)",(void *)0x0);
    lVar8 = archive_entry_size(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'\x8b',0,"0",lVar8,"archive_entry_size(ae)",(void *)0x0);
    tVar9 = archive_entry_mtime(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'\x8c',0x15181,"86401",tVar9,"archive_entry_mtime(ae)",(void *)0x0);
    tVar9 = archive_entry_atime(ae);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,L'\x8d',0x15181,"86401",tVar9,"archive_entry_atime(ae)",(void *)0x0);
    psVar7 = archive_entry_stat((archive_entry_conflict *)ae);
    v2_01 = psVar7->st_nlink;
    wVar2 = L'\x8e';
    v1 = 2;
    pcVar6 = "2";
LAB_0016dcd7:
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_read_format_iso_xorriso.c"
                        ,wVar2,v1,pcVar6,v2_01,"archive_entry_stat(ae)->st_nlink",(void *)0x0);
  } while( true );
}

Assistant:

DEFINE_TEST(test_read_format_iso_xorriso)
{
	const char *refname = "test_read_format_iso_xorriso.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 10 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 10; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));

		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */
			assertEqualInt(4, archive_entry_nlink(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("./dir", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_nlink(ae));
		} else if (strcmp("./dir2", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_nlink(ae));
		} else if (strcmp("./file",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(6, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_nlink(ae));
		} else if (strcmp("./hardlink",
		    archive_entry_pathname(ae)) == 0) {
			/* A hardlink to the regular file. */
			/* Note: If "hardlink" gets returned before "file",
			 * then "hardlink" will get returned as a regular file
			 * and "file" will get returned as the hardlink.
			 * This test should tolerate that, since it's a
			 * perfectly permissible thing for libarchive to do. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualString("./file", archive_entry_hardlink(ae));
			assertEqualInt(0, archive_entry_size_is_set(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
		} else if (strcmp("./symlink",
		    archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
		} else if (strcmp("./empty",
		    archive_entry_pathname(ae)) == 0) {
			/* A empty file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else if (strcmp("./dir/file2",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(7, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello2\n", 7);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else if (strcmp("./dir/file3",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(7, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello3\n", 7);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else if (strcmp("./dir2/file4",
		    archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(7, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello4\n", 7);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_nlink(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}